

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

sexp_conflict
sexp_condition_variable_signal
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict condvar)

{
  bool bVar1;
  sexp_conflict ls2;
  sexp_conflict ls1;
  sexp_conflict condvar_local;
  sexp_sint_t n_local;
  sexp_conflict self_local;
  sexp_conflict ctx_local;
  
  ls1 = (sexp_conflict)&DAT_0000023e;
  ls2 = (sexp_conflict)(((ctx->value).type.setters)->value).context.mark_stack[10].end;
  while( true ) {
    bVar1 = false;
    if (((ulong)ls2 & 3) == 0) {
      bVar1 = ls2->tag == 6;
    }
    if (!bVar1) break;
    if ((((ls2->value).type.name)->value).opcode.dl == condvar) {
      if (ls1 == (sexp_conflict)&DAT_0000023e) {
        (((ctx->value).type.setters)->value).context.mark_stack[10].end =
             (sexp_conflict *)(ls2->value).type.cpl;
      }
      else {
        (ls1->value).type.cpl = (ls2->value).type.cpl;
      }
      (ls2->value).type.cpl = (sexp)(((ctx->value).type.setters)->value).context.mark_stack[9].prev;
      (((ctx->value).type.setters)->value).context.mark_stack[9].prev = (sexp_mark_stack_ptr_t *)ls2
      ;
      if ((((ls2->value).string.offset & 3) != 0) || (((ls2->value).type.cpl)->tag != 6)) {
        (((ctx->value).type.setters)->value).context.mark_stack[10].start = (sexp_conflict *)ls2;
      }
      (((ls2->value).type.name)->value).flonum_bits[0x60a2] = '\0';
      (((ls2->value).type.name)->value).flonum_bits[0x60a3] = '\0';
      return (sexp_conflict)&DAT_0000013e;
    }
    ls1 = ls2;
    ls2 = (ls2->value).type.cpl;
  }
  return (sexp_conflict)0x3e;
}

Assistant:

sexp sexp_condition_variable_signal (sexp ctx, sexp self, sexp_sint_t n, sexp condvar) {
  sexp ls1=SEXP_NULL, ls2=sexp_global(ctx, SEXP_G_THREADS_PAUSED);
  for ( ; sexp_pairp(ls2); ls1=ls2, ls2=sexp_cdr(ls2))
    if (sexp_context_event(sexp_car(ls2)) == condvar) {
      if (ls1==SEXP_NULL)
        sexp_global(ctx, SEXP_G_THREADS_PAUSED) = sexp_cdr(ls2);
      else
        sexp_cdr(ls1) = sexp_cdr(ls2);
      sexp_cdr(ls2) = sexp_global(ctx, SEXP_G_THREADS_FRONT);
      sexp_global(ctx, SEXP_G_THREADS_FRONT) = ls2;
      if (! sexp_pairp(sexp_cdr(ls2)))
        sexp_global(ctx, SEXP_G_THREADS_BACK) = ls2;
      sexp_context_waitp(sexp_car(ls2)) = sexp_context_timeoutp(sexp_car(ls2)) = 0;
      return SEXP_TRUE;
    }
  return SEXP_FALSE;
}